

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O2

void leaveblock(FuncState *fs)

{
  int *piVar1;
  LexState *ls;
  BlockCnt *pBVar2;
  BlockCnt *pBVar3;
  Dyndata *pDVar4;
  Dyndata *pDVar5;
  Labeldesc *pLVar6;
  byte bVar7;
  int iVar8;
  int iVar9;
  TString *name;
  LocVar *pLVar10;
  int i;
  uint uVar11;
  
  ls = fs->ls;
  pBVar2 = fs->bl;
  if ((pBVar2->previous != (BlockCnt *)0x0) && (pBVar2->upval != '\0')) {
    iVar8 = luaK_jump(fs);
    luaK_patchclose(fs,iVar8,(uint)pBVar2->nactvar);
    luaK_patchtohere(fs,iVar8);
  }
  if (pBVar2->isloop != '\0') {
    name = luaS_new(ls->L,"break");
    iVar8 = newlabelentry(ls,&ls->dyd->label,name,0,ls->fs->pc);
    findgotos(ls,(ls->dyd->label).arr + iVar8);
  }
  pBVar3 = pBVar2->previous;
  fs->bl = pBVar3;
  bVar7 = pBVar2->nactvar;
  uVar11 = (uint)fs->nactvar;
  pDVar4 = fs->ls->dyd;
  piVar1 = &(pDVar4->actvar).n;
  *piVar1 = *piVar1 + ((uint)bVar7 - (uint)fs->nactvar);
  while (bVar7 <= uVar11 && uVar11 != bVar7) {
    iVar8 = fs->pc;
    uVar11 = uVar11 - 1;
    fs->nactvar = (lu_byte)uVar11;
    pLVar10 = getlocvar(fs,uVar11 & 0xff);
    pLVar10->endpc = iVar8;
  }
  fs->freereg = (lu_byte)uVar11;
  pDVar5 = ls->dyd;
  (pDVar5->label).n = pBVar2->firstlabel;
  iVar8 = pBVar2->firstgoto;
  if (pBVar3 == (BlockCnt *)0x0) {
    if (iVar8 < (pDVar5->gt).n) {
      undefgoto(ls,(pDVar5->gt).arr + iVar8);
    }
  }
  else {
    for (; iVar8 < (pDVar4->gt).n; iVar8 = iVar8 + (uint)(iVar9 == 0)) {
      pLVar6 = (pDVar4->gt).arr;
      bVar7 = pBVar2->nactvar;
      if (bVar7 < pLVar6[iVar8].nactvar) {
        if (pBVar2->upval != '\0') {
          luaK_patchclose(fs,pLVar6[iVar8].pc,(uint)bVar7);
          bVar7 = pBVar2->nactvar;
        }
        pLVar6[iVar8].nactvar = bVar7;
      }
      iVar9 = findlabel(fs->ls,iVar8);
    }
  }
  return;
}

Assistant:

static void leaveblock(FuncState *fs) {
    BlockCnt *bl = fs->bl;
    LexState *ls = fs->ls;
    if (bl->previous && bl->upval) {
        /* create a 'jump to here' to close upvalues */
        int j = luaK_jump(fs);
        luaK_patchclose(fs, j, bl->nactvar);
        luaK_patchtohere(fs, j);
    }
    if (bl->isloop)
        breaklabel(ls);  /* close pending breaks */
    fs->bl = bl->previous;
    removevars(fs, bl->nactvar);
    lua_assert(bl->nactvar == fs->nactvar);
    fs->freereg = fs->nactvar;  /* free registers */
    ls->dyd->label.n = bl->firstlabel;  /* remove local labels */
    if (bl->previous)  /* inner block? */
        movegotosout(fs, bl);  /* update pending gotos to outer block */
    else if (bl->firstgoto < ls->dyd->gt.n)  /* pending gotos in outer block? */
        undefgoto(ls, &ls->dyd->gt.arr[bl->firstgoto]);  /* error */
}